

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O2

void __thiscall
mp::ArrayRef<double>::init_from_rvalue<mp::ArrayRef<double>>
          (ArrayRef<double> *this,ArrayRef<double> *other)

{
  double *pdVar1;
  size_t sVar2;
  
  if ((other->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (other->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pdVar1 = other->data_;
    sVar2 = other->size_;
  }
  else {
    std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->save_);
    pdVar1 = (this->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = (long)(this->save_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  }
  this->data_ = pdVar1;
  this->size_ = sVar2;
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }